

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

AttribMap * __thiscall
deqp::egl::Image::TextureImageSource::getCreateAttribs
          (AttribMap *__return_storage_ptr__,TextureImageSource *this)

{
  mapped_type_conflict *pmVar1;
  key_type_conflict local_20;
  undefined1 local_19;
  TextureImageSource *local_18;
  TextureImageSource *this_local;
  AttribMap *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TextureImageSource *)__return_storage_ptr__;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (__return_storage_ptr__);
  local_20 = 0x30bc;
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_20);
  *pmVar1 = 0;
  return __return_storage_ptr__;
}

Assistant:

AttribMap TextureImageSource::getCreateAttribs (void) const
{
	AttribMap ret;

	ret[EGL_GL_TEXTURE_LEVEL_KHR] = 0;

	return ret;
}